

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O0

void __thiscall ConfidentialTxIn_SetIssuance_Test::TestBody(ConfidentialTxIn_SetIssuance_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  AssertHelper local_640;
  Message local_638;
  ByteData256 local_630;
  string local_618;
  undefined1 local_5f8 [8];
  AssertionResult gtest_ar_10;
  Message local_5e0;
  string local_5d8;
  ByteData local_5b8;
  string local_5a0;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_9;
  Message local_568;
  string local_560;
  ByteData local_540;
  string local_528;
  undefined1 local_508 [8];
  AssertionResult gtest_ar_8;
  Message local_4f0;
  string local_4e8;
  ConfidentialValue local_4c8;
  string local_4a0;
  undefined1 local_480 [8];
  AssertionResult gtest_ar_7;
  Message local_468;
  string local_460;
  ConfidentialValue local_440;
  string local_418;
  undefined1 local_3f8 [8];
  AssertionResult gtest_ar_6;
  Message local_3e0;
  string local_3d8;
  ByteData256 local_3b8;
  string local_3a0;
  undefined1 local_380 [8];
  AssertionResult gtest_ar_5;
  Message local_368;
  string local_360;
  ByteData256 local_340;
  string local_328;
  undefined1 local_308 [8];
  AssertionResult gtest_ar_4;
  Message local_2f0;
  string local_2e8;
  Script local_2c8;
  string local_290;
  undefined1 local_270 [8];
  AssertionResult gtest_ar_3;
  Message local_258;
  string local_250;
  Txid local_230;
  string local_210;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar_2;
  Message local_1d8;
  uint32_t local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar_1;
  Message local_1b0;
  uint32_t local_1a4;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar;
  Message local_188 [3];
  undefined1 local_170 [8];
  ConfidentialTxIn txin;
  ConfidentialTxIn_SetIssuance_Test *this_local;
  
  txin.pegin_witness_.witness_stack_.
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  cfd::core::ConfidentialTxIn::ConfidentialTxIn
            ((ConfidentialTxIn *)local_170,&exp_txid,2,0xfffffffe,&exp_script);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::ConfidentialTxIn::SetIssuance
                ((ConfidentialTxIn *)local_170,&exp_blinding_nonce,&exp_asset_entropy,
                 &exp_issuance_amount,&exp_inflation_keys,&exp_issuance_amount_rangeproof,
                 &exp_inflation_keys_rangeproof);
    }
  }
  else {
    testing::Message::Message(local_188);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8d,
               "Expected: (txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar.message_,local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar.message_);
    testing::Message::~Message(local_188);
  }
  local_1a4 = cfd::core::AbstractTxIn::GetVout((AbstractTxIn *)local_170);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1a0,"txin.GetVout()","exp_index",&local_1a4,&exp_index);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_1b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_1b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1cc = cfd::core::AbstractTxIn::GetSequence((AbstractTxIn *)local_170);
  testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
            ((EqHelper<false> *)local_1c8,"txin.GetSequence()","exp_sequence",&local_1cc,
             &exp_sequence);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
  if (!bVar1) {
    testing::Message::Message(&local_1d8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_1d8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
  cfd::core::AbstractTxIn::GetTxid(&local_230,(AbstractTxIn *)local_170);
  cfd::core::Txid::GetHex_abi_cxx11_(&local_210,&local_230);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Txid::GetHex_abi_cxx11_(&local_250,&exp_txid);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1f0,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",
             pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_210);
  cfd::core::Txid::~Txid(&local_230);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
  if (!bVar1) {
    testing::Message::Message(&local_258);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1f0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x91,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_258);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
  cfd::core::AbstractTxIn::GetUnlockingScript(&local_2c8,(AbstractTxIn *)local_170);
  cfd::core::Script::GetHex_abi_cxx11_(&local_290,&local_2c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::Script::GetHex_abi_cxx11_(&local_2e8,&exp_script);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_270,"txin.GetUnlockingScript().GetHex().c_str()",
             "exp_script.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_2e8);
  std::__cxx11::string::~string((string *)&local_290);
  cfd::core::Script::~Script(&local_2c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_270);
  if (!bVar1) {
    testing::Message::Message(&local_2f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_270);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x93,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_2f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_2f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_270);
  cfd::core::ConfidentialTxIn::GetBlindingNonce(&local_340,(ConfidentialTxIn *)local_170);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_328,&local_340);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_360,&exp_blinding_nonce);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_308,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_360);
  std::__cxx11::string::~string((string *)&local_328);
  cfd::core::ByteData256::~ByteData256(&local_340);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
  if (!bVar1) {
    testing::Message::Message(&local_368);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x95,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_368);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_368);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
  cfd::core::ConfidentialTxIn::GetAssetEntropy(&local_3b8,(ConfidentialTxIn *)local_170);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_3a0,&local_3b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_3d8,&exp_asset_entropy);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_380,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3a0);
  cfd::core::ByteData256::~ByteData256(&local_3b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_380);
  if (!bVar1) {
    testing::Message::Message(&local_3e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_380);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_3e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_380);
  cfd::core::ConfidentialTxIn::GetIssuanceAmount(&local_440,(ConfidentialTxIn *)local_170);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_418,&local_440);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_460,&exp_issuance_amount);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_3f8,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_460);
  std::__cxx11::string::~string((string *)&local_418);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_440);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_468);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x99,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_468);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_468);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f8);
  cfd::core::ConfidentialTxIn::GetInflationKeys(&local_4c8,(ConfidentialTxIn *)local_170);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_4a0,&local_4c8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_(&local_4e8,&exp_inflation_keys);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_480,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4a0);
  cfd::core::ConfidentialValue::~ConfidentialValue(&local_4c8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_480);
  if (!bVar1) {
    testing::Message::Message(&local_4f0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_480);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_4f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_4f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_480);
  cfd::core::ConfidentialTxIn::GetIssuanceAmountRangeproof(&local_540,(ConfidentialTxIn *)local_170)
  ;
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_528,&local_540);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_560,&exp_issuance_amount_rangeproof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_508,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_560);
  std::__cxx11::string::~string((string *)&local_528);
  cfd::core::ByteData::~ByteData(&local_540);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_508);
  if (!bVar1) {
    testing::Message::Message(&local_568);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_508);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_9.message_,&local_568);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
    testing::Message::~Message(&local_568);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_508);
  cfd::core::ConfidentialTxIn::GetInflationKeysRangeproof(&local_5b8,(ConfidentialTxIn *)local_170);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_5a0,&local_5b8);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_5d8,&exp_inflation_keys_rangeproof);
  pcVar3 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_580,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",pcVar2,pcVar3);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::~string((string *)&local_5a0);
  cfd::core::ByteData::~ByteData(&local_5b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
  if (!bVar1) {
    testing::Message::Message(&local_5e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_10.message_,&local_5e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
    testing::Message::~Message(&local_5e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
  cfd::core::ConfidentialTxIn::GetWitnessHash(&local_630,(ConfidentialTxIn *)local_170);
  cfd::core::ByteData256::GetHex_abi_cxx11_(&local_618,&local_630);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_5f8,"txin.GetWitnessHash().GetHex().c_str()",
             "\"66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300\"",pcVar2,
             "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
  std::__cxx11::string::~string((string *)&local_618);
  cfd::core::ByteData256::~ByteData256(&local_630);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f8);
  if (!bVar1) {
    testing::Message::Message(&local_638);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_5f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_640,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xa1,pcVar2);
    testing::internal::AssertHelper::operator=(&local_640,&local_638);
    testing::internal::AssertHelper::~AssertHelper(&local_640);
    testing::Message::~Message(&local_638);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_5f8);
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn((ConfidentialTxIn *)local_170);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetIssuance) {
  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_NO_THROW((txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
}